

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall
stick::String::concatWithAllocator<stick::String,stick::String>
          (String *__return_storage_ptr__,String *this,Allocator *_alloc,String *_args,
          String *_args_1)

{
  Size SVar1;
  Size SVar2;
  int unpack2 [3];
  Size off;
  int unpack [3];
  Size len;
  String *_args_local_1;
  String *_args_local;
  Allocator *_alloc_local;
  String *ret;
  
  SVar1 = detail::_StringCopier::strLen((String *)_alloc);
  SVar2 = detail::_StringCopier::strLen(_args);
  String(__return_storage_ptr__,(Allocator *)this);
  resize(__return_storage_ptr__,SVar2 + SVar1);
  unpack2[1] = 0;
  unpack2[2] = 0;
  detail::_StringCopier::performCopy(__return_storage_ptr__,(Size *)(unpack2 + 1),(String *)_alloc);
  detail::_StringCopier::performCopy(__return_storage_ptr__,(Size *)(unpack2 + 1),_args);
  return __return_storage_ptr__;
}

Assistant:

inline String String::concatWithAllocator(Allocator & _alloc, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    String ret(_alloc);
    ret.resize(len);
    Size off = 0;
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(ret, off, _args))... };
    STICK_UNUSED(unpack2);
    return ret;
}